

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

void spvtools::opt::ReplacePhiParentWith(Instruction *inst,uint32_t orig_block,uint32_t new_block)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *this;
  uint32_t uVar1;
  uint32_t local_94;
  iterator local_90;
  undefined8 local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  uint32_t local_54;
  iterator local_50;
  undefined8 local_48;
  SmallVector<unsigned_int,_2UL> local_40;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t new_block_local;
  uint32_t orig_block_local;
  Instruction *inst_local;
  
  local_18 = new_block;
  local_14 = orig_block;
  _new_block_local = inst;
  uVar1 = Instruction::GetSingleWordInOperand(inst,1);
  this = _new_block_local;
  if (uVar1 == local_14) {
    local_54 = local_18;
    local_50 = &local_54;
    local_48 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_50;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list_00);
    Instruction::SetInOperand(this,1,&local_40);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_40);
  }
  else {
    local_94 = local_18;
    local_90 = &local_94;
    local_88 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_90;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list);
    Instruction::SetInOperand(this,3,&local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
  }
  return;
}

Assistant:

void ReplacePhiParentWith(Instruction* inst, uint32_t orig_block,
                          uint32_t new_block) {
  if (inst->GetSingleWordInOperand(1) == orig_block) {
    inst->SetInOperand(1, {new_block});
  } else {
    inst->SetInOperand(3, {new_block});
  }
}